

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_status fdb_kvs_cmp_check(fdb_kvs_handle *handle)

{
  undefined1 uVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  fdb_status fVar7;
  avl_node *paVar8;
  char *pcVar9;
  long in_RDI;
  char *kvs_name_3;
  char *kvs_name_2;
  char *kvs_name_1;
  char *kvs_name;
  avl_node *a;
  list_elem *e;
  kvs_node query;
  kvs_node *kvs_node;
  cmp_func_node *cmp_node;
  filemgr *file;
  void *ori_custom_param;
  fdb_custom_cmp_variable ori_custom_cmp;
  fdb_file_handle *fhandle;
  int ori_flag;
  avl_cmp_func *in_stack_fffffffffffffeb8;
  avl_node *in_stack_fffffffffffffec0;
  avl_tree *in_stack_fffffffffffffec8;
  char *local_130;
  avl_node *local_128;
  list_elem *local_120;
  filemgr *in_stack_ffffffffffffff80;
  fdb_kvs_handle *in_stack_ffffffffffffff88;
  
  lVar2 = *(long *)(in_RDI + 0x28);
  lVar3 = *(long *)(in_RDI + 0x48);
  pthread_spin_lock((pthread_spinlock_t *)(*(long *)(lVar3 + 0x170) + 0x38));
  uVar1 = *(undefined1 *)(*(long *)(lVar3 + 0x170) + 0x28);
  uVar4 = *(undefined8 *)(*(long *)(lVar3 + 0x170) + 8);
  uVar5 = *(undefined8 *)(*(long *)(lVar3 + 0x170) + 0x10);
  if (*(long *)(lVar2 + 0x10) != 0) {
    *(undefined8 *)(in_RDI + 8) = 0;
    *(undefined8 *)(in_RDI + 0x10) = 0;
    for (local_120 = list_begin(*(list **)(lVar2 + 0x10)); local_120 != (list_elem *)0x0;
        local_120 = list_next(local_120)) {
      if ((local_120[-2].next == (list_elem *)0x0) ||
         (iVar6 = strcmp((char *)local_120[-2].next,default_kvs_name), iVar6 == 0)) {
        *(list_elem **)(in_RDI + 8) = local_120[-1].prev;
        *(list_elem **)(in_RDI + 0x10) = local_120[-1].next;
        *(list_elem **)(*(long *)(lVar3 + 0x170) + 8) = local_120[-1].prev;
        *(list_elem **)(*(long *)(lVar3 + 0x170) + 0x10) = local_120[-1].next;
        *(undefined1 *)(*(long *)(lVar3 + 0x170) + 0x28) = 1;
      }
      else {
        paVar8 = avl_search(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                            in_stack_fffffffffffffeb8);
        if (paVar8 != (avl_node *)0x0) {
          if (paVar8[-6].right == (avl_node *)0x0) {
            paVar8[-6].right = (avl_node *)local_120[-1].prev;
            paVar8[-5].parent = (avl_node *)local_120[-1].next;
          }
          *(undefined1 *)(*(long *)(lVar3 + 0x170) + 0x28) = 1;
        }
      }
    }
  }
  if ((*(ulong *)(lVar2 + 0x18) & 2) != 0) {
    if (((*(ulong *)(lVar2 + 0x18) & 4) != 0) && (*(long *)(in_RDI + 8) == 0)) {
      *(undefined1 *)(*(long *)(lVar3 + 0x170) + 0x28) = uVar1;
      *(undefined8 *)(*(long *)(lVar3 + 0x170) + 8) = uVar4;
      *(undefined8 *)(*(long *)(lVar3 + 0x170) + 0x10) = uVar5;
      pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(lVar3 + 0x170) + 0x38));
      local_130 = _fdb_kvs_get_name(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      if (local_130 == (char *)0x0) {
        local_130 = "default";
      }
      fVar7 = fdb_log_impl((err_log_callback *)(in_RDI + 0x168),2,FDB_RESULT_INVALID_CMP_FUNCTION,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                           ,"fdb_kvs_cmp_check",400,
                           "Error! Tried to open a KV store \'%s\', which was created with custom compare function enabled, without passing the same custom compare function."
                           ,local_130);
      return fVar7;
    }
    if (((*(ulong *)(lVar2 + 0x18) & 4) == 0) && (*(long *)(in_RDI + 8) != 0)) {
      *(undefined1 *)(*(long *)(lVar3 + 0x170) + 0x28) = uVar1;
      *(undefined8 *)(*(long *)(lVar3 + 0x170) + 8) = uVar4;
      *(undefined8 *)(*(long *)(lVar3 + 0x170) + 0x10) = uVar5;
      pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(lVar3 + 0x170) + 0x38));
      pcVar9 = _fdb_kvs_get_name(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      if (pcVar9 == (char *)0x0) {
        pcVar9 = "default";
      }
      fVar7 = fdb_log_impl((err_log_callback *)(in_RDI + 0x168),2,FDB_RESULT_INVALID_CMP_FUNCTION,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                           ,"fdb_kvs_cmp_check",0x1a2,
                           "Error! Tried to open a KV store \'%s\', which was created without custom compare function, by passing custom compare function."
                           ,pcVar9);
      return fVar7;
    }
  }
  paVar8 = avl_first(*(avl_tree **)(*(long *)(lVar3 + 0x170) + 0x18));
  while( true ) {
    local_128 = paVar8;
    if (local_128 == (avl_node *)0x0) {
      pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(lVar3 + 0x170) + 0x38));
      return FDB_RESULT_SUCCESS;
    }
    paVar8 = avl_next(local_128);
    if ((((ulong)local_128[-6].left & 1) != 0) && (local_128[-6].right == (avl_node *)0x0)) break;
    if ((((ulong)local_128[-6].left & 1) == 0) && (local_128[-6].right != (avl_node *)0x0)) {
      *(undefined1 *)(*(long *)(lVar3 + 0x170) + 0x28) = uVar1;
      *(undefined8 *)(*(long *)(lVar3 + 0x170) + 8) = uVar4;
      *(undefined8 *)(*(long *)(lVar3 + 0x170) + 0x10) = uVar5;
      pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(lVar3 + 0x170) + 0x38));
      pcVar9 = _fdb_kvs_get_name(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      if (pcVar9 == (char *)0x0) {
        pcVar9 = "default";
      }
      fVar7 = fdb_log_impl((err_log_callback *)(in_RDI + 0x168),2,FDB_RESULT_INVALID_CMP_FUNCTION,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                           ,"fdb_kvs_cmp_check",0x1ce,
                           "Error! Tried to open a KV store \'%s\', which was created without custom compare function, by passing custom compare function."
                           ,pcVar9);
      return fVar7;
    }
  }
  *(undefined1 *)(*(long *)(lVar3 + 0x170) + 0x28) = uVar1;
  *(undefined8 *)(*(long *)(lVar3 + 0x170) + 8) = uVar4;
  *(undefined8 *)(*(long *)(lVar3 + 0x170) + 0x10) = uVar5;
  pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(lVar3 + 0x170) + 0x38));
  pcVar9 = _fdb_kvs_get_name(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (pcVar9 == (char *)0x0) {
    pcVar9 = "default";
  }
  fVar7 = fdb_log_impl((err_log_callback *)(in_RDI + 0x168),2,FDB_RESULT_INVALID_CMP_FUNCTION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                       ,"fdb_kvs_cmp_check",0x1bc,
                       "Error! Tried to open a KV store \'%s\', which was created with custom compare function enabled, without passing the same custom compare function."
                       ,pcVar9);
  return fVar7;
}

Assistant:

fdb_status fdb_kvs_cmp_check(fdb_kvs_handle *handle)
{
    int ori_flag;
    fdb_file_handle *fhandle = handle->fhandle;
    fdb_custom_cmp_variable ori_custom_cmp;
    void* ori_custom_param;
    struct filemgr *file = handle->file;
    struct cmp_func_node *cmp_node;
    struct kvs_node *kvs_node, query;
    struct list_elem *e;
    struct avl_node *a;

    spin_lock(&file->kv_header->lock);
    ori_flag = file->kv_header->custom_cmp_enabled;
    ori_custom_cmp = file->kv_header->default_kvs_cmp;
    ori_custom_param = file->kv_header->default_kvs_cmp_param;

    // Assign from `fhandle->cmp_func_list` to `file->kv_header`.
    if (fhandle->cmp_func_list) {
        handle->kvs_config.custom_cmp = NULL;
        handle->kvs_config.custom_cmp_param = NULL;

        e = list_begin(fhandle->cmp_func_list);
        while (e) {
            cmp_node = _get_entry(e, struct cmp_func_node, le);
            if ( cmp_node->kvs_name == NULL ||
                 !strcmp(cmp_node->kvs_name, default_kvs_name) ) { // default KVS
                handle->kvs_config.custom_cmp = cmp_node->func;
                handle->kvs_config.custom_cmp_param = cmp_node->user_param;
                file->kv_header->default_kvs_cmp = cmp_node->func;
                file->kv_header->default_kvs_cmp_param = cmp_node->user_param;
                file->kv_header->custom_cmp_enabled = 1;
            } else {
                // search by name
                query.kvs_name = cmp_node->kvs_name;
                a = avl_search(file->kv_header->idx_name,
                               &query.avl_name,
                               _kvs_cmp_name);
                if (a) { // found
                    kvs_node = _get_entry(a, struct kvs_node, avl_name);
                    if (!kvs_node->custom_cmp) {
                        kvs_node->custom_cmp = cmp_node->func;
                        kvs_node->user_param = cmp_node->user_param;
                    }
                    file->kv_header->custom_cmp_enabled = 1;
                }
            }
            e = list_next(&cmp_node->le);
        }
    }

    // first check the default KVS
    // 1. root handle has not been opened yet: don't care
    // 2. root handle was opened before: must match the flag
    if (fhandle->flags & FHANDLE_ROOT_INITIALIZED) {
        if (fhandle->flags & FHANDLE_ROOT_CUSTOM_CMP &&
            handle->kvs_config.custom_cmp == NULL) {
            // custom cmp function was assigned before,
            // but no custom cmp function is assigned
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created with "
                           "custom compare function enabled, without passing the same "
                           "custom compare function.", kvs_name);
        }
        if (!(fhandle->flags & FHANDLE_ROOT_CUSTOM_CMP) &&
              handle->kvs_config.custom_cmp) {
            // custom cmp function was not assigned before,
            // but custom cmp function is assigned from user
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created without "
                           "custom compare function, by passing custom compare function.",
                    kvs_name);
        }
    }

    // next check other KVSs
    a = avl_first(file->kv_header->idx_name);
    while (a) {
        kvs_node = _get_entry(a, struct kvs_node, avl_name);
        a = avl_next(a);

        if (kvs_node->flags & KVS_FLAG_CUSTOM_CMP &&
            kvs_node->custom_cmp == NULL) {
            // custom cmp function was assigned before,
            // but no custom cmp function is assigned
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created with "
                           "custom compare function enabled, without passing the same "
                           "custom compare function.", kvs_name);
        }
        if (!(kvs_node->flags & KVS_FLAG_CUSTOM_CMP) &&
              kvs_node->custom_cmp) {
            // custom cmp function was not assigned before,
            // but custom cmp function is assigned from user
            file->kv_header->custom_cmp_enabled = ori_flag;
            file->kv_header->default_kvs_cmp = ori_custom_cmp;
            file->kv_header->default_kvs_cmp_param = ori_custom_param;
            spin_unlock(&file->kv_header->lock);
            const char *kvs_name = _fdb_kvs_get_name(handle, handle->file);
            if (!kvs_name) {
                kvs_name = DEFAULT_KVS_NAME;
            }
            return fdb_log(&handle->log_callback, FDB_LOG_ERROR,
                           FDB_RESULT_INVALID_CMP_FUNCTION,
                           "Error! Tried to open a KV store '%s', which was created without "
                           "custom compare function, by passing custom compare function.",
                           kvs_name);
        }
    }

    spin_unlock(&file->kv_header->lock);
    return FDB_RESULT_SUCCESS;
}